

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O2

int who(vector<cUser,_std::allocator<cUser>_> *currUsers,int new_fd)

{
  pointer paVar1;
  ssize_t sVar2;
  int iVar3;
  pointer paVar4;
  undefined1 local_a0 [8];
  cUser user;
  size_type *local_58;
  string names;
  
  local_58 = &names._M_string_length;
  names._M_dataplus._M_p = (pointer)0x0;
  names._M_string_length._0_1_ = 0;
  paVar1 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  names.field_2._12_4_ = new_fd;
  for (paVar4 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                super__Vector_impl_data._M_start; paVar4 != paVar1; paVar4 = paVar4 + 1) {
    anon_struct_40_2_6a8bb0e8::cUser((anon_struct_40_2_6a8bb0e8 *)local_a0,paVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&user.id," "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::append((string *)&local_58);
    std::__cxx11::string::~string((string *)&user.id);
    std::__cxx11::string::~string((string *)local_a0);
  }
  if (names._M_dataplus._M_p < (pointer)0x100) {
    sVar2 = send(names.field_2._12_4_,local_58,0xff,0);
    iVar3 = 1;
    if (sVar2 == -1) {
      perror("send");
    }
  }
  else {
    iVar3 = 0;
    std::operator<<((ostream *)&std::cerr,"We in some trouble with this");
  }
  std::__cxx11::string::~string((string *)&local_58);
  return iVar3;
}

Assistant:

int who(vector<cUser>& currUsers,int new_fd){
    string names;

    // add all the currently logged in user's names to the string
    for(cUser user : currUsers){
        names += (" " + user.username);
    }

    // make sure its not to long
    if(names.length() > MAXDATASIZE - 1){
        cerr << "We in some trouble with this";
        return 0;
    }

    //send it back to the client
    if (send(new_fd, names.c_str(), MAXDATASIZE - 1, 0) == -1)
        perror("send");

    return 1;

}